

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkDataTypes.cpp
# Opt level: O2

NTrodeObj * __thiscall
TrodesConfig::getNTrode(NTrodeObj *__return_storage_ptr__,TrodesConfig *this,int index)

{
  pointer pNVar1;
  
  pNVar1 = (this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (index < (int)(((long)(this->nTrodes).super__Vector_base<NTrodeObj,_std::allocator<NTrodeObj>_>
                           ._M_impl.super__Vector_impl_data._M_finish - (long)pNVar1) / 0x48)) {
    NTrodeObj::NTrodeObj(__return_storage_ptr__,pNVar1 + index);
  }
  else {
    NTrodeObj::NTrodeObj(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

NTrodeObj TrodesConfig::getNTrode(int index) const{
    if (index >= (int)nTrodes.size()) {
        return NTrodeObj();
    }
    return(nTrodes[index]);
}